

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_EndProcessing
                  (PaAlsaStreamComponent *self,unsigned_long numFrames,int *xrun)

{
  snd_pcm_format_t sVar1;
  undefined8 uVar2;
  snd_pcm_t *psVar3;
  snd_pcm_uframes_t sVar4;
  long lVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  snd_pcm_sframes_t sVar9;
  ssize_t sVar10;
  pthread_t __thread1;
  char *errorText;
  undefined1 *puVar11;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  long local_60;
  undefined1 *local_58;
  int local_50;
  int local_4c;
  int __pa_unsure_error_id;
  int i;
  uchar *buffer;
  ulong uStack_38;
  int bufsize;
  unsigned_long __vla_expr0;
  int local_28;
  PaError local_24;
  int res;
  PaError result;
  int *xrun_local;
  unsigned_long numFrames_local;
  PaAlsaStreamComponent *self_local;
  
  local_24 = 0;
  local_28 = 0;
  if (self->ready != 0) {
    puVar11 = auStack_68;
    _res = xrun;
    xrun_local = (int *)numFrames;
    numFrames_local = (unsigned_long)self;
    if ((self->canMmap == 0) && (puVar11 = auStack_68, self->streamDir == StreamDirection_Out)) {
      if (self->hostInterleaved == 0) {
        uStack_38 = (ulong)(uint)self->numHostChannels;
        lVar5 = -(uStack_38 * 8 + 0xf & 0xfffffffffffffff0);
        local_58 = auStack_68 + lVar5;
        sVar1 = self->nativeFormat;
        sVar4 = self->framesPerPeriod;
        __vla_expr0 = (unsigned_long)auStack_68;
        *(undefined8 *)(auStack_68 + lVar5 + -8) = 0x11d487;
        sVar10 = (*alsa_snd_pcm_format_size)(sVar1,sVar4 + 1);
        piVar7 = xrun_local;
        puVar11 = local_58;
        buffer._4_4_ = (int)sVar10;
        ___pa_unsure_error_id = *(long *)(numFrames_local + 0x20);
        for (local_4c = 0; local_4c < *(int *)(numFrames_local + 0xc); local_4c = local_4c + 1) {
          *(long *)(local_58 + (long)local_4c * 8) = ___pa_unsure_error_id;
          ___pa_unsure_error_id = ___pa_unsure_error_id + buffer._4_4_;
        }
        uVar2 = *(undefined8 *)(numFrames_local + 0x38);
        *(undefined8 *)(auStack_68 + lVar5 + -8) = 0x11d4ee;
        local_28 = (*(code *)alsa_snd_pcm_writen)(uVar2,puVar11,piVar7);
        puVar11 = (undefined1 *)__vla_expr0;
      }
      else {
        uStack_70 = 0x11d438;
        sVar9 = (*alsa_snd_pcm_writei)(self->pcm,self->nonMmapBuffer,numFrames);
        local_28 = (int)sVar9;
        puVar11 = auStack_68;
      }
    }
    piVar7 = xrun_local;
    if (*(int *)(numFrames_local + 0x18) != 0) {
      psVar3 = *(snd_pcm_t **)(numFrames_local + 0x38);
      sVar4 = *(snd_pcm_uframes_t *)(numFrames_local + 0x68);
      *(undefined8 *)(puVar11 + -8) = 0x11d521;
      sVar9 = (*alsa_snd_pcm_mmap_commit)(psVar3,sVar4,(snd_pcm_uframes_t)piVar7);
      local_28 = (int)sVar9;
    }
    if ((local_28 == -0x20) || (local_28 == -0x56)) {
      *_res = 1;
    }
    else {
      local_50 = local_28;
      if (local_28 < 0) {
        *(undefined8 *)(puVar11 + -8) = 0x11d55c;
        __thread1 = pthread_self();
        *(undefined8 *)(puVar11 + -8) = 0x11d56e;
        iVar8 = pthread_equal(__thread1,paUnixMainThread);
        iVar6 = local_50;
        if (iVar8 != 0) {
          local_60 = (long)local_50;
          *(undefined8 *)(puVar11 + -8) = 0x11d587;
          errorText = (*alsa_snd_strerror)(iVar6);
          lVar5 = local_60;
          *(undefined8 *)(puVar11 + -8) = 0x11d598;
          PaUtil_SetLastHostErrorInfo(paALSA,lVar5,errorText);
        }
        *(undefined8 *)(puVar11 + -8) = 0x11d5a6;
        PaUtil_DebugPrint(
                         "Expression \'res\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3497\n"
                         );
        local_24 = -9999;
      }
    }
  }
  return local_24;
}

Assistant:

static PaError PaAlsaStreamComponent_EndProcessing( PaAlsaStreamComponent *self, unsigned long numFrames, int *xrun )
{
    PaError result = paNoError;
    int res = 0;

    /* @concern FullDuplex It is possible that only one direction is marked ready after polling, and processed
     * afterwards
     */
    if( !self->ready )
        goto end;

    if( !self->canMmap && StreamDirection_Out == self->streamDir )
    {
        /* Play sound */
        if( self->hostInterleaved )
            res = alsa_snd_pcm_writei( self->pcm, self->nonMmapBuffer, numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            int bufsize = alsa_snd_pcm_format_size( self->nativeFormat, self->framesPerPeriod + 1 );
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += bufsize;
            }
            res = alsa_snd_pcm_writen( self->pcm, bufs, numFrames );
        }
    }

    if( self->canMmap )
        res = alsa_snd_pcm_mmap_commit( self->pcm, self->offset, numFrames );

    if( res == -EPIPE || res == -ESTRPIPE )
    {
        *xrun = 1;
    }
    else
    {
        ENSURE_( res, paUnanticipatedHostError );
    }

end:
error:
    return result;
}